

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandCof(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fConst1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode;
  char *pcVar2;
  char *format;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar2 = "Empty network.\n";
    }
    else {
      if (pNtk->ntkType == ABC_NTK_LOGIC) {
        if (globalUtilOptind + 2 == argc) {
          pNode = Abc_NtkFindCi(pNtk,argv[globalUtilOptind]);
          if ((pNode == (Abc_Obj_t *)0x0) &&
             (pNode = Abc_NtkFindNode(pNtk,argv[globalUtilOptind]), pNode == (Abc_Obj_t *)0x0)) {
            pcVar2 = argv[globalUtilOptind];
            format = "Cannot find node \"%s\".\n";
          }
          else {
            pcVar2 = argv[(long)globalUtilOptind + 1];
            fConst1 = atoi(pcVar2);
            if (fConst1 < 2) {
              Abc_ObjReplaceByConstant(pNode,fConst1);
              return 0;
            }
            format = "Constant should be 0 or 1.\n";
          }
          Abc_Print(-1,format,pcVar2);
          return 1;
        }
        Abc_Print(-1,"Wrong number of auguments.\n");
        goto LAB_0022c0f5;
      }
      pcVar2 = "Currently can only be applied to a logic network.\n";
    }
    iVar1 = -1;
  }
  else {
LAB_0022c0f5:
    iVar1 = -2;
    Abc_Print(-2,"usage: cof [-h] <node> <const>\n");
    Abc_Print(-2,"\t          replaces one node in a logic network by constant 0 or 1\n");
    Abc_Print(-2,"\t-h      : print the command usage\n");
    Abc_Print(-2,"\t<node>  : the node to replace\n");
    Abc_Print(-2,"\t<const> : the constant to replace the node with\n");
    pcVar2 = "\tname    : the node name\n";
  }
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandCof( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pNode;
    int c, Const;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
       case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Currently can only be applied to a logic network.\n" );
        return 1;
    }

    if ( argc != globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    pNode = Abc_NtkFindCi( pNtk, argv[globalUtilOptind] );
    if ( pNode == NULL )
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
    if ( pNode == NULL )
    {
        Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
        return 1;
    }
    Const = atoi( argv[globalUtilOptind+1] );
    if ( Const != 0 && Const != 1 )
    {
        Abc_Print( -1, "Constant should be 0 or 1.\n", argv[globalUtilOptind+1] );
        return 1;
    }
    Abc_ObjReplaceByConstant( pNode, Const );
    return 0;

usage:
    Abc_Print( -2, "usage: cof [-h] <node> <const>\n" );
    Abc_Print( -2, "\t          replaces one node in a logic network by constant 0 or 1\n" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<node>  : the node to replace\n");
    Abc_Print( -2, "\t<const> : the constant to replace the node with\n");
    Abc_Print( -2, "\tname    : the node name\n");
    return 1;
}